

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  RPlidarDriver *pRVar4;
  long lVar5;
  uint32_t time_start;
  char *pcVar6;
  uint32_t in_R9D;
  int i;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  rplidar_response_measurement_node_hq_t arStack_7108 [359];
  undefined8 uStack_65d0;
  rplidar_response_measurement_node_hq_t local_65c8;
  rplidar_response_measurement_node_hq_t nodes [2880];
  undefined1 local_bc0 [8];
  LaserScan scan;
  rplidar_response_device_info_t devinfo;
  ulong local_38;
  size_t count;
  
  uStack_65d0 = 0x104a09;
  poVar3 = std::operator<<((ostream *)&std::cout,"progress begins ...");
  uStack_65d0 = 0x104a11;
  std::endl<char,std::char_traits<char>>(poVar3);
  uStack_65d0 = 0x104a18;
  pRVar4 = (RPlidarDriver *)rp::standalone::rplidar::RPlidarDriver::CreateDriver(0);
  if (pRVar4 == (RPlidarDriver *)0x0) {
    uStack_65d0 = 0x104cc9;
    fwrite("insufficent memory, exit\n",0x19,1,_stderr);
    return 0;
  }
  uStack_65d0 = 0x104a3a;
  iVar1 = (*(code *)**(undefined8 **)pRVar4)(pRVar4,"/dev/ttyUSB1",0x1c200,0);
  if (iVar1 < 0) {
    pcVar6 = "connected failed ...";
  }
  else {
    uStack_65d0 = 0x104a50;
    iVar1 = (**(code **)(*(long *)pRVar4 + 0x50))(pRVar4,scan.intensities + 0x166,2000);
    if (iVar1 < 0) {
      uStack_65d0 = 0x104a8d;
      poVar3 = std::operator<<((ostream *)&std::cout,"get device information failed");
      uStack_65d0 = 0x104a95;
      std::endl<char,std::char_traits<char>>(poVar3);
      uStack_65d0 = 0x104aa1;
      (**(code **)(*(long *)pRVar4 + 0xe0))(pRVar4);
      pRVar4 = (RPlidarDriver *)0x0;
      goto LAB_00104aa4;
    }
    pcVar6 = "connected successfully ...";
  }
  uStack_65d0 = 0x104a77;
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
  uStack_65d0 = 0x104a7f;
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_00104aa4:
  uStack_65d0 = 0x104aad;
  (**(code **)(*(long *)pRVar4 + 0x68))(pRVar4);
  iVar1 = 0;
  uStack_65d0 = 0x104ac3;
  (**(code **)(*(long *)pRVar4 + 0x38))(pRVar4,0,1,0);
  lVar7 = 0;
LAB_00104ad1:
  do {
    local_38 = 0xb40;
    uStack_65d0 = 0x104af1;
    iVar2 = (**(code **)(*(long *)pRVar4 + 0xb0))(pRVar4,&local_65c8,&local_38);
    lVar5 = lVar7;
    if (iVar2 == 0) {
      uStack_65d0 = 0x104afe;
      lVar5 = getCurrentTime_ms();
      if (iVar1 == 0) {
        iVar1 = 1;
        lVar7 = lVar5;
        goto LAB_00104ad1;
      }
      iVar1 = iVar1 + 1;
      uStack_65d0 = 0x104b2a;
      poVar3 = std::operator<<((ostream *)&std::cout,"delta_time = ");
      uStack_65d0 = 0x104b35;
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      uStack_65d0 = 0x104b3d;
      std::endl<char,std::char_traits<char>>(poVar3);
      uStack_65d0 = 0x104b50;
      iVar2 = (**(code **)(*(long *)pRVar4 + 0xc0))(pRVar4,&local_65c8,local_38);
      if (iVar2 == 0) {
        uStack_65d0 = 0x104b6b;
        poVar3 = std::operator<<((ostream *)&std::cout,"in here ...");
        uStack_65d0 = 0x104b73;
        std::endl<char,std::char_traits<char>>(poVar3);
        memset(arStack_7108,0,0xb40);
        time_start = 0;
        for (uVar8 = 0; uVar8 < local_38; uVar8 = uVar8 + 1) {
          if (nodes[uVar8 - 1].dist_mm_q2 != 0) {
            fVar10 = (float)nodes[uVar8 - 1].angle_z_q14 * 90.0 * 6.1035156e-05;
            fVar9 = (float)(int)fVar10;
            if (fVar9 < (float)(int)time_start) {
              time_start = (uint32_t)fVar10;
            }
            iVar2 = (int)(fVar9 - (float)(int)time_start);
            if (0x166 < iVar2) {
              iVar2 = 0x167;
            }
            arStack_7108[iVar2] = nodes[uVar8 - 1];
          }
        }
        publish_scan(arStack_7108,(LaserScan *)local_bc0,0x168,time_start,
                     (double)(lVar5 - lVar7) * 0.001,false,0.0,6.265732,8.0,in_R9D);
      }
    }
    lVar7 = lVar5;
    if (ctrl_c_pressed == true) {
      uStack_65d0 = 0x104c8b;
      (**(code **)(*(long *)pRVar4 + 0xa0))(pRVar4,2000);
      uStack_65d0 = 0x104c94;
      (**(code **)(*(long *)pRVar4 + 0x70))(pRVar4);
      uStack_65d0 = 0x104c9c;
      rp::standalone::rplidar::RPlidarDriver::DisposeDriver(pRVar4);
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	std::cout<<"progress begins ..."<<std::endl;

	slam::sensor::LaserScan scan;

	long previous_time = 0;
	long current_time = 0;
	long delta_time = 0;

	const char * opt_com_path = "/dev/ttyUSB1";
	_u32 opt_com_baudrate = 115200;
	u_result op_result;
	
	bool angle_compensate = true;
	int angle_compensate_multiple = 1;
	bool inverted = false;	

	// create the driver instance
        RPlidarDriver * drv = RPlidarDriver::CreateDriver(DRIVER_TYPE_SERIALPORT);

	if (!drv) {
        	fprintf(stderr, "insufficent memory, exit\n");
        	return false;
    	}
	
	rplidar_response_device_info_t devinfo;
	if (IS_OK(drv->connect(opt_com_path, opt_com_baudrate)))
        {
            op_result = drv->getDeviceInfo(devinfo);

            if (IS_OK(op_result))
            {   
              	std::cout<<"connected successfully ..."<<std::endl;
            }
            else
            {
		std::cout<<"get device information failed"<<std::endl;
                delete drv;
                drv = NULL;
            }
        }
	else{
		std::cout<<"connected failed ..."<<std::endl;
	}

	drv->startMotor();
	drv->startScan( 0, 1 );
	
	uint32_t scan_num  = 0;
	while(1){
		rplidar_response_measurement_node_hq_t nodes[360 * 8];
		size_t   count = _countof(nodes);
		op_result = drv->grabScanDataHq( nodes, count );
		
		if( op_result == RESULT_OK ){
			scan_num ++;
			if( scan_num == 1 ){
				current_time = previous_time = getCurrentTime_ms();
				continue;
			}
			current_time = getCurrentTime_ms();
			delta_time = current_time - previous_time;
			std::cout<<"delta_time = "<<delta_time<<std::endl;
			op_result = drv->ascendScanData( nodes, count );
			float angle_min = DEG2RAD( 0.0f );
			float angle_max = DEG2RAD( 359.0f );
			if( op_result == RESULT_OK ){
				if( angle_compensate ){
					std::cout<<"in here ..."<<std::endl;
					const int angle_compensate_nodes_count = 360 * angle_compensate_multiple;
					int angle_compensate_offset = 0;
					rplidar_response_measurement_node_hq_t angle_compensate_nodes[ angle_compensate_nodes_count ];
					memset( angle_compensate_nodes, 0, angle_compensate_nodes_count * sizeof( rplidar_response_measurement_node_hq_t ) );
					
					for( int i = 0; i < count; i ++ ){
						if( nodes[i].dist_mm_q2 != 0 ){
							float angle = getAngle( nodes[i] );
							float angle_value = (int)( angle * angle_compensate_multiple );
							if( ( angle_value - angle_compensate_offset ) < 0 ) angle_compensate_offset = angle_value;
							for( int j = 0; j < angle_compensate_multiple; j ++ ){
								int angle_compensate_nodes_index = angle_value - angle_compensate_offset + j ;
								if( angle_compensate_nodes_index >= angle_compensate_nodes_count )
									angle_compensate_nodes_index = angle_compensate_nodes_count - 1 ;
								angle_compensate_nodes[angle_compensate_nodes_index] = nodes[i];
							}
						}
					}
					
					publish_scan( angle_compensate_nodes, scan, angle_compensate_nodes_count, \
						        current_time, ( double )( delta_time * 0.001 ), inverted, angle_min, angle_max, 8.0, scan_num );
				}
				else{
					int start_node = 0, end_node = 0;
					int i = 0;	
					while( nodes[i++].dist_mm_q2 == 0 );
					start_node = i - 1;
					i = count - 1;
					while( nodes[i--].dist_mm_q2 == 0 );
					end_node = i + 1;

					angle_min = DEG2RAD( getAngle( nodes[start_node] ) );
					angle_max = DEG2RAD( getAngle( nodes[end_node] ) );

					publish_scan( nodes, scan, count, current_time, ( double )( delta_time * 0.001 ), inverted, angle_min, angle_max, 8.0, scan_num );
				}
			}
			else if( op_result == RESULT_OPERATION_FAIL ){
				float angle_min = DEG2RAD( 0.0f );
				float angle_max = DEG2RAD( 359.0f );
				//publish_scan(  );
			}

			previous_time = current_time;
		}
		
		if( ctrl_c_pressed ){
			break;
		}
        }
	
	drv->stop();
	drv->stopMotor();
	RPlidarDriver::DisposeDriver(drv);
    	drv = NULL;

	
	return 0;
}